

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

iterator __thiscall
slang::SmallVectorBase<(anonymous_namespace)::Constructable>::erase
          (SmallVectorBase<(anonymous_namespace)::Constructable> *this,const_iterator pos)

{
  Constructable *in_RCX;
  
  std::ranges::__move_fn::
  operator()<(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*,_(anonymous_namespace)::Constructable_*>
            ((__move_fn *)(pos + 1),this->data_ + this->len,pos,in_RCX);
  pop_back(this);
  return pos;
}

Assistant:

iterator erase(const_iterator pos) {
        // const_cast is fine, this is a non-const member function.
        iterator result = const_cast<iterator>(pos);

        std::ranges::move(result + 1, end(), result);
        pop_back();
        return result;
    }